

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::Config_testPropagationFormat_Test::TestBody(Config_testPropagationFormat_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_210 [8];
  Message local_208 [8];
  Format local_200 [2];
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  Node local_1d8;
  undefined1 local_1b8 [8];
  Config config;
  char *kConfigYAML;
  Config_testPropagationFormat_Test *this_local;
  
  config._baggageRestrictions._refreshInterval.__r = (rep)anon_var_dwarf_cae1;
  YAML::Load(&local_1d8.m_isValid);
  Config::parse((Config *)local_1b8,&local_1d8);
  YAML::Node::~Node(&local_1d8);
  local_200[1] = 1;
  local_200[0] = Config::propagationFormat((Config *)local_1b8);
  testing::internal::EqHelper<false>::
  Compare<jaegertracing::propagation::Format,jaegertracing::propagation::Format>
            ((EqHelper<false> *)local_1f8,"propagation::Format::W3C","config.propagationFormat()",
             local_200 + 1,local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (local_210,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(local_210,local_208);
    testing::internal::AssertHelper::~AssertHelper(local_210);
    testing::Message::~Message(local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  Config::~Config((Config *)local_1b8);
  return;
}

Assistant:

TEST(Config, testPropagationFormat)
{
    {
        constexpr auto kConfigYAML = R"cfg(
propagation_format: w3c
)cfg";
        const auto config = Config::parse(YAML::Load(kConfigYAML));
        ASSERT_EQ(propagation::Format::W3C, config.propagationFormat());
    }
}